

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O1

shared_ptr<MyCompiler::Factor> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::Factor>(RecursiveDescentParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  istream *piVar2;
  long lVar3;
  long lVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  RecursiveDescentParser *in_RSI;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<MyCompiler::Ident> sVar9;
  shared_ptr<MyCompiler::Number> sVar10;
  shared_ptr<MyCompiler::Factor> sVar11;
  string local_48;
  
  this->stream = (istream *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<MyCompiler::Factor,std::allocator<MyCompiler::Factor>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->currentToken,(Factor **)this,
             (allocator<MyCompiler::Factor> *)&local_48);
  if (in_RSI->sym == NUMBER) {
    *(undefined4 *)(this->stream + 4) = 1;
    sVar10 = parse<MyCompiler::Number>((RecursiveDescentParser *)&local_48);
    _Var7 = sVar10.super___shared_ptr<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    piVar2 = this->stream;
    p_Var8 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar2 + 0x60);
    *(pointer *)(piVar2 + 0x58) = local_48._M_dataplus._M_p;
    *(size_type *)(piVar2 + 0x60) = local_48._M_string_length;
LAB_001066a4:
    local_48._M_string_length = 0;
    local_48._M_dataplus._M_p = (pointer)0x0;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length;
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
      _Var7._M_pi = extraout_RDX;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length;
    }
  }
  else {
    if (in_RSI->sym == IDENT) {
      *(undefined4 *)(this->stream + 4) = 0;
      sVar9 = parse<MyCompiler::Ident>((RecursiveDescentParser *)&local_48);
      _Var7 = sVar9.super___shared_ptr<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
      piVar2 = this->stream;
      p_Var8 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar2 + 0x50);
      *(pointer *)(piVar2 + 0x48) = local_48._M_dataplus._M_p;
      *(size_type *)(piVar2 + 0x50) = local_48._M_string_length;
      goto LAB_001066a4;
    }
    paVar1 = &local_48.field_2;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"expression expected","");
    except(in_RSI,LPAREN,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,(ulong)(local_48.field_2._M_allocated_capacity + 1))
      ;
    }
    *(undefined4 *)(this->stream + 4) = 2;
    parse<MyCompiler::Expression>((RecursiveDescentParser *)&local_48);
    sVar6 = local_48._M_string_length;
    _Var5._M_p = local_48._M_dataplus._M_p;
    piVar2 = this->stream;
    local_48._M_dataplus._M_p = (pointer)0x0;
    local_48._M_string_length = 0;
    p_Var8 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar2 + 0x70);
    *(pointer *)(piVar2 + 0x68) = _Var5._M_p;
    *(size_type *)(piVar2 + 0x70) = sVar6;
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length);
    }
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"right parenthesis expected","");
    except(in_RSI,RPAREN,&local_48);
    _Var7._M_pi = extraout_RDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,(ulong)(local_48.field_2._M_allocated_capacity + 1))
      ;
      _Var7._M_pi = extraout_RDX_02;
    }
    piVar2 = this->stream;
    lVar3 = *(long *)(piVar2 + 0x68);
    if ((*(long *)(lVar3 + 0x48) != 0) || (*(long *)(lVar3 + 0x68) != *(long *)(lVar3 + 0x70)))
    goto LAB_001067bf;
    lVar3 = *(long *)(lVar3 + 0x58);
    lVar4 = *(long *)(lVar3 + 0x48);
    if ((*(int *)(lVar4 + 4) != 1) || (*(long *)(lVar3 + 0x58) != *(long *)(lVar3 + 0x60)))
    goto LAB_001067bf;
    *(undefined4 *)(piVar2 + 4) = 1;
    *(undefined8 *)(piVar2 + 0x58) = *(undefined8 *)(lVar4 + 0x58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(piVar2 + 0x60),
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar4 + 0x60));
    piVar2 = this->stream;
    *(undefined8 *)(piVar2 + 0x68) = 0;
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar2 + 0x70);
    *(undefined8 *)(piVar2 + 0x70) = 0;
    _Var7._M_pi = extraout_RDX_03;
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var7._M_pi = extraout_RDX_00;
  }
LAB_001067bf:
  sVar11.super___shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  sVar11.super___shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::Factor>)
         sVar11.super___shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::Factor> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<Factor>();

    if (sym == SymbolType::IDENT)
    {
        pResult->caseNum = 0;
        pResult->pIdent = parse<Ident>();
    }
    else if (sym == SymbolType::NUMBER)
    {
        pResult->caseNum = 1;
        pResult->pNumber = parse<Number>();
    }
    else
    {
        except(SymbolType::LPAREN, "expression expected");
        pResult->caseNum = 2;
        pResult->pExpression = parse<Expression>();
        except(SymbolType::RPAREN, "right parenthesis expected");
        if (pResult->pExpression->pAddSubOp == nullptr && pResult->pExpression->vAddSubOpExpression.empty() &&
            pResult->pExpression->pTerm->pFactor->caseNum == 1 && pResult->pExpression->pTerm->vMulDivOpFactor.empty())
        {
            pResult->caseNum = 1;
            pResult->pNumber = pResult->pExpression->pTerm->pFactor->pNumber;
            pResult->pExpression = nullptr;
        }
    }

    return pResult;
}